

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr_gtest_utils.cpp
# Opt level: O2

void __thiscall unodb::test::QSBRTestBase::QSBRTestBase(QSBRTestBase *this)

{
  invoke_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_laurynas_biveinis[P]unodb_test_qsbr_gtest_utils_hpp:57:9)>
  iVar1;
  qsbr_per_thread *this_00;
  qsbr *this_01;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__QSBRTestBase_0014ed08;
  (this->last_epoch).epoch_val = '\0';
  detail::qsbr_epoch::assert_invariant(&this->last_epoch);
  iVar1 = must_not_allocate<unodb::test::QSBRTestBase::is_qsbr_paused()::_lambda()_1_>();
  if (iVar1) {
    this_00 = qsbr_per_thread::get_instance();
    qsbr_per_thread::qsbr_resume(this_00);
  }
  expect_idle_qsbr();
  this_01 = qsbr::instance();
  qsbr::reset_stats(this_01);
  return;
}

Assistant:

QSBRTestBase::QSBRTestBase() {
  if (is_qsbr_paused()) unodb::this_thread().qsbr_resume();
  unodb::test::expect_idle_qsbr();
#ifdef UNODB_DETAIL_WITH_STATS
  unodb::qsbr::instance().reset_stats();
#endif  // UNODB_DETAIL_WITH_STATS
}